

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

string * __thiscall
t_swift_generator::function_signature_abi_cxx11_
          (string *__return_storage_ptr__,t_swift_generator *this,t_function *tfunction)

{
  uint uVar1;
  string *psVar2;
  t_struct *tstruct;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  t_type *local_e8;
  t_type *ttype;
  string local_d8;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_48;
  undefined1 local_21;
  t_function *local_20;
  t_function *tfunction_local;
  t_swift_generator *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = tfunction;
  tfunction_local = (t_function *)this;
  this_local = (t_swift_generator *)__return_storage_ptr__;
  if ((this->gen_cocoa_ & 1U) == 0) {
    psVar2 = t_function::get_name_abi_cxx11_(tfunction);
    std::__cxx11::string::string((string *)&local_48,(string *)psVar2);
  }
  else {
    function_name_abi_cxx11_(&local_48,this,tfunction);
  }
  std::operator+(__return_storage_ptr__,"func ",&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  tstruct = t_function::get_arglist(local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d8,"",(allocator *)((long)&ttype + 7));
  argument_list(&local_b8,this,tstruct,&local_d8,false);
  std::operator+(&local_98,"(",&local_b8);
  std::operator+(&local_78,&local_98,") throws");
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&ttype + 7));
  local_e8 = t_function::get_returntype(local_20);
  uVar1 = (*(local_e8->super_t_doc)._vptr_t_doc[4])();
  if ((uVar1 & 1) == 0) {
    type_name_abi_cxx11_(&local_128,this,local_e8,false,false);
    std::operator+(&local_108," -> ",&local_128);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_swift_generator::function_signature(t_function* tfunction) {

  string result = "func " + (gen_cocoa_ ? function_name(tfunction) : tfunction->get_name());

  result += "(" + argument_list(tfunction->get_arglist(), "", false) + ") throws"; /// argsreview

  t_type* ttype = tfunction->get_returntype();
  if (!ttype->is_void()) {
    result += " -> " + type_name(ttype);
  }

  return result;
}